

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_image.h
# Opt level: O3

Texture * TextureImage::Texture::loadTexture(string *_name,string *_filename)

{
  pointer pcVar1;
  GLenum GVar2;
  int iVar3;
  GLubyte *pGVar4;
  size_t sVar5;
  ostream *poVar6;
  FILE *__stream;
  Texture *pTVar7;
  stbi_uc *retval_from_stbi_load;
  undefined8 uVar8;
  undefined8 uVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*>_>,_bool>
  pVar10;
  int channels;
  int width;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  Texture *local_60;
  int height;
  string local_50;
  
  GVar2 = glGetError();
  if (GVar2 != 0) {
    pGVar4 = glewGetErrorString(GVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR before loadTexture():",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    if (pGVar4 == (GLubyte *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x28a5e8);
    }
    else {
      sVar5 = strlen((char *)pGVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)pGVar4,sVar5)
      ;
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(_name->_M_dataplus)._M_p,_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<>",2);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(_filename->_M_dataplus)._M_p,_filename->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if ((_filename->_M_string_length == 0) ||
     (iVar3 = std::__cxx11::string::compare((char *)_filename), iVar3 == 0)) {
    pcVar1 = (_name->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + _name->_M_string_length);
    testAllSuffix((string *)&width,&local_50);
    std::__cxx11::string::operator=((string *)_filename,(string *)&width);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_width != &local_70) {
      operator_delete(_width,local_70._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (_filename->_M_string_length == 0) goto LAB_001339e7;
  }
  __stream = fopen((_filename->_M_dataplus)._M_p,"r");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    pTVar7 = (Texture *)operator_new(0x60);
    pTVar7->_vptr_Texture = (_func_int **)&PTR__Texture_0025b460;
    pTVar7->available = false;
    (pTVar7->name)._M_dataplus._M_p = (pointer)&(pTVar7->name).field_2;
    (pTVar7->name)._M_string_length = 0;
    (pTVar7->name).field_2._M_local_buf[0] = '\0';
    (pTVar7->filename)._M_dataplus._M_p = (pointer)&(pTVar7->filename).field_2;
    (pTVar7->filename)._M_string_length = 0;
    (pTVar7->filename).field_2._M_local_buf[0] = '\0';
    pTVar7->width = 0;
    pTVar7->height = 0;
    pTVar7->tex = 0;
    pcVar1 = (_name->_M_dataplus)._M_p;
    _width = (pointer)&local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&width,pcVar1,pcVar1 + _name->_M_string_length);
    local_60 = pTVar7;
    pVar10 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TextureImage::Texture*>,std::_Select1st<std::pair<std::__cxx11::string_const,TextureImage::Texture*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TextureImage::Texture*>>>
             ::_M_insert_unique<std::pair<std::__cxx11::string_const,TextureImage::Texture*>>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TextureImage::Texture*>,std::_Select1st<std::pair<std::__cxx11::string_const,TextureImage::Texture*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TextureImage::Texture*>>>
                         *)allTexture_abi_cxx11_,
                        (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*>
                         *)&width);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_width != &local_70) {
      operator_delete(_width,local_70._M_allocated_capacity + 1);
    }
    pTVar7 = *(Texture **)(pVar10.first._M_node._M_node + 2);
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      sVar5 = (pTVar7->filename)._M_string_length;
      if ((sVar5 == _filename->_M_string_length) &&
         (((sVar5 == 0 ||
           (iVar3 = bcmp((pTVar7->filename)._M_dataplus._M_p,(_filename->_M_dataplus)._M_p,sVar5),
           iVar3 == 0)) && (pTVar7->available != false)))) {
        return pTVar7;
      }
      clear(pTVar7);
    }
    std::__cxx11::string::_M_assign((string *)&pTVar7->name);
    std::__cxx11::string::_M_assign((string *)&pTVar7->filename);
    stbi_set_flip_vertically_on_load(1);
    retval_from_stbi_load = stbi_load((_filename->_M_dataplus)._M_p,&width,&height,&channels,0);
    if (retval_from_stbi_load == (stbi_uc *)0x0) {
      return (Texture *)error;
    }
    uVar8 = 0x2002;
    if (channels != 1) {
      uVar8 = 0x1908;
    }
    uVar9 = 0x8227;
    if (channels != 2) {
      uVar9 = uVar8;
    }
    uVar8 = 0x1907;
    if (channels != 3) {
      uVar8 = uVar9;
    }
    glGenTextures(1,&pTVar7->tex);
    glBindTexture(0xde1,pTVar7->tex);
    glTexParameteri(0xde1,0x2802,0x2901);
    glTexParameteri(0xde1,0x2803,0x2901);
    glTexParameteri(0xde1,0x2800,0x2601);
    glTexParameteri(0xde1,0x2801,0x2601);
    glTexImage2D(0xde1,0,0x1908,pTVar7->width,pTVar7->height,0,uVar8,0x1401,retval_from_stbi_load);
    (*__glewGenerateMipmap)(0xde1);
    glBindTexture(0xde1,0);
    stbi_image_free(retval_from_stbi_load);
    GVar2 = glGetError();
    if (GVar2 != 0) {
      pGVar4 = glewGetErrorString(GVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERROR in loadTexture():",0x17);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      if (pGVar4 == (GLubyte *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x28a5e8);
      }
      else {
        sVar5 = strlen((char *)pGVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)pGVar4,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      return (Texture *)error;
    }
    pTVar7->available = true;
    return pTVar7;
  }
LAB_001339e7:
  return (Texture *)error;
}

Assistant:

static Texture &loadTexture(std::string _name, std::string _filename = std::string()) {
            GLenum gl_error_code = GL_NO_ERROR;
            if ((gl_error_code = glGetError()) != GL_NO_ERROR) {
                const GLubyte *errString = glewGetErrorString(gl_error_code);
                std::cout << "ERROR before loadTexture():" << std::endl;
                std::cout << errString << std::endl;
            }
            std::cout << _name << "<>" << _filename << std::endl;
            if (_filename.empty() || _filename == "") {
                _filename = testAllSuffix(_name);
                if (_filename.empty()) return error;
            }
            FILE *fi = fopen(_filename.c_str(), "r");
            if (fi == NULL) return error;
            fclose(fi);

            std::pair<Name2Texture::iterator, bool> insertion =
                    allTexture.insert(Name2Texture::value_type(_name, new Texture()));
            Texture &target = *(insertion.first->second);
            if (!insertion.second) {
                if (target.filename == _filename && target.available) {
                    return target;
                } else {
                    target.clear();
                }
            }

            target.name = _name;
            target.filename = _filename;

            stbi_set_flip_vertically_on_load(true);
            int width, height, channels;
            unsigned char *data =
                    stbi_load(_filename.c_str(), &width, &height, &channels, 0);
            if (!data) {
                return error;
            }

            GLenum format = GL_RGBA;
            if (channels == 1) {
                format = GL_R;
            }
            if (channels == 2) {
                format = GL_RG;
            }
            if (channels == 3) {
                format = GL_RGB;
            }

            glGenTextures(1, &target.tex);
            glBindTexture(GL_TEXTURE_2D, target.tex);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, target.width, target.height,
                         0, format, GL_UNSIGNED_BYTE, data);
            glGenerateMipmap(GL_TEXTURE_2D);
            glBindTexture(GL_TEXTURE_2D, 0);

            stbi_image_free(data);

            if ((gl_error_code = glGetError()) != GL_NO_ERROR) {
                const GLubyte *errString = glewGetErrorString(gl_error_code);
                std::cout << "ERROR in loadTexture():" << std::endl;
                std::cout << errString << std::endl;
                return error;
            }

            target.available = true;
            return target;
        }